

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void testDiamondCompare<wasm::analysis::Tuple<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>>>
               (Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *lattice,
               Element *bot,Element *a,Element *b,Element *top)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2c0;
  Message local_2b8;
  LatticeComparison local_2b0;
  LatticeComparison local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_15;
  Message local_290;
  LatticeComparison local_288;
  LatticeComparison local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_14;
  Message local_268;
  LatticeComparison local_260;
  LatticeComparison local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_13;
  Message local_240;
  LatticeComparison local_238;
  LatticeComparison local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_12;
  Message local_218;
  LatticeComparison local_210;
  LatticeComparison local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_11;
  Message local_1f0;
  LatticeComparison local_1e8;
  LatticeComparison local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_10;
  Message local_1c8;
  LatticeComparison local_1c0;
  LatticeComparison local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_9;
  Message local_1a0;
  LatticeComparison local_198;
  LatticeComparison local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_8;
  Message local_178;
  LatticeComparison local_170;
  LatticeComparison local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_7;
  Message local_150;
  LatticeComparison local_148;
  LatticeComparison local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_6;
  Message local_128;
  LatticeComparison local_120;
  LatticeComparison local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  LatticeComparison local_f8;
  LatticeComparison local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  LatticeComparison local_d0;
  LatticeComparison local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  LatticeComparison local_a8;
  LatticeComparison local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  LatticeComparison local_80;
  LatticeComparison local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  LatticeComparison local_48;
  LatticeComparison local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Element *top_local;
  Element *b_local;
  Element *a_local;
  Element *bot_local;
  Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *lattice_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )top;
  local_44 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
             compare(lattice,bot,bot);
  local_48 = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_40,"lattice.compare(bot, bot)","analysis::EQUAL",&local_44,&local_48)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_7c = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
             compare(lattice,bot,a);
  local_80 = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_78,"lattice.compare(bot, a)","analysis::LESS",&local_7c,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_a4 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
             compare(lattice,bot,b);
  local_a8 = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_a0,"lattice.compare(bot, b)","analysis::LESS",&local_a4,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_cc = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
             compare(lattice,bot,
                     (Element *)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  local_d0 = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_c8,"lattice.compare(bot, top)","analysis::LESS",&local_cc,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f4 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
             compare(lattice,a,bot);
  local_f8 = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_f0,"lattice.compare(a, bot)","analysis::GREATER",&local_f4,&local_f8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_11c = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,a,a);
  local_120 = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_118,"lattice.compare(a, a)","analysis::EQUAL",&local_11c,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_144 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,a,b);
  local_148 = NO_RELATION;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_140,"lattice.compare(a, b)","analysis::NO_RELATION",&local_144,
             &local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_16c = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,a,
                      (Element *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_170 = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_168,"lattice.compare(a, top)","analysis::LESS",&local_16c,&local_170)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_194 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,b,bot);
  local_198 = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_190,"lattice.compare(b, bot)","analysis::GREATER",&local_194,
             &local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1bc = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,b,a);
  local_1c0 = NO_RELATION;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_1b8,"lattice.compare(b, a)","analysis::NO_RELATION",&local_1bc,
             &local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_1e4 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,b,b);
  local_1e8 = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_1e0,"lattice.compare(b, b)","analysis::EQUAL",&local_1e4,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_20c = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,b,
                      (Element *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_210 = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_208,"lattice.compare(b, top)","analysis::LESS",&local_20c,&local_210)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_234 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,(Element *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,bot);
  local_238 = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_230,"lattice.compare(top, bot)","analysis::GREATER",&local_234,
             &local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_25c = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,(Element *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,a);
  local_260 = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_258,"lattice.compare(top, a)","analysis::GREATER",&local_25c,
             &local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_284 = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,(Element *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,b);
  local_288 = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_280,"lattice.compare(top, b)","analysis::GREATER",&local_284,
             &local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2ac = wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::
              compare(lattice,(Element *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,
                      (Element *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_2b0 = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_2a8,"lattice.compare(top, top)","analysis::EQUAL",&local_2ac,
             &local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  return;
}

Assistant:

void testDiamondCompare(const L& lattice,
                        const typename L::Element& bot,
                        const typename L::Element& a,
                        const typename L::Element& b,
                        const typename L::Element& top) {
  EXPECT_EQ(lattice.compare(bot, bot), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(bot, a), analysis::LESS);
  EXPECT_EQ(lattice.compare(bot, b), analysis::LESS);
  EXPECT_EQ(lattice.compare(bot, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(a, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(a, a), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(a, b), analysis::NO_RELATION);
  EXPECT_EQ(lattice.compare(a, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(b, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(b, a), analysis::NO_RELATION);
  EXPECT_EQ(lattice.compare(b, b), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(b, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(top, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, a), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, b), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, top), analysis::EQUAL);
}